

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

bool __thiscall DOptionMenu::MouseEvent(DOptionMenu *this,int type,int x,int y)

{
  FOptionMenuDescriptor *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint y_00;
  FOptionMenuItem *pFVar5;
  
  pFVar5 = this->mFocusControl;
  pFVar1 = this->mDesc;
  y_00 = y / CleanYfac_1 - pFVar1->mDrawTop;
  if (pFVar5 != (FOptionMenuItem *)0x0) {
LAB_0033c787:
    (*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[0xe])
              (pFVar5,(ulong)(uint)type,(ulong)(uint)x,(ulong)y_00);
    return true;
  }
  uVar3 = (int)y_00 / OptionSettings.mLinespacing;
  if (pFVar1->mScrollTop <= (int)uVar3) {
    uVar3 = uVar3 + pFVar1->mScrollPos;
  }
  if (uVar3 < (pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count) {
    pFVar5 = (pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[(int)uVar3];
    iVar4 = (*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[5])
                      (pFVar5,&OptionSettings,
                       (long)(int)y_00 % (long)OptionSettings.mLinespacing & 0xffffffff);
    if ((char)iVar4 != '\0') {
      pFVar1 = this->mDesc;
      if (uVar3 != pFVar1->mSelectedItem) {
        pFVar1->mSelectedItem = uVar3;
      }
      pFVar5 = (pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[(int)uVar3]
      ;
      goto LAB_0033c787;
    }
  }
  this->mDesc->mSelectedItem = -1;
  bVar2 = DMenu::MouseEvent(&this->super_DMenu,type,x,y_00);
  return bVar2;
}

Assistant:

bool DOptionMenu::MouseEvent(int type, int x, int y)
{
	y = (y / CleanYfac_1) - mDesc->mDrawTop;

	if (mFocusControl)
	{
		mFocusControl->MouseEvent(type, x, y);
		return true;
	}
	else
	{
		int yline = (y / OptionSettings.mLinespacing);
		if (yline >= mDesc->mScrollTop)
		{
			yline += mDesc->mScrollPos;
		}
		if ((unsigned)yline < mDesc->mItems.Size() && mDesc->mItems[yline]->Selectable())
		{
			if (yline != mDesc->mSelectedItem)
			{
				mDesc->mSelectedItem = yline;
				//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			}
			mDesc->mItems[yline]->MouseEvent(type, x, y);
			return true;
		}
	}
	mDesc->mSelectedItem = -1;
	return Super::MouseEvent(type, x, y);
}